

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::File(string *__return_storage_ptr__,Namer *this,string *filename,SkipFile skips)

{
  SkipFile SVar1;
  bool local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  byte local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_26;
  byte local_25;
  SkipFile local_24;
  bool skip_ext;
  bool skip_suffix;
  string *psStack_20;
  SkipFile skips_local;
  string *filename_local;
  Namer *this_local;
  
  local_24 = skips;
  psStack_20 = filename;
  filename_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  SVar1 = operator&(skips,Suffix);
  local_25 = SVar1 != None;
  SVar1 = operator&(local_24,Extension);
  local_26 = SVar1 != None;
  ConvertCase(&local_68,psStack_20,(this->config_).filenames,kUpperCamel);
  local_8a = 0;
  if ((local_25 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_88,(string *)&(this->config_).filename_suffix);
  }
  else {
    std::allocator<char>::allocator();
    local_8a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  }
  std::operator+(&local_48,&local_68,&local_88);
  local_c2 = (local_26 & 1) == 0;
  if (local_c2) {
    std::__cxx11::string::string((string *)&local_c0,(string *)&(this->config_).filename_extension);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  }
  local_c2 = !local_c2;
  std::operator+(__return_storage_ptr__,&local_48,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (local_c2) {
    std::allocator<char>::~allocator(&local_c1);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator(&local_89);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string File(const std::string &filename,
                           SkipFile skips = SkipFile::None) const {
    const bool skip_suffix = (skips & SkipFile::Suffix) != SkipFile::None;
    const bool skip_ext = (skips & SkipFile::Extension) != SkipFile::None;
    return ConvertCase(filename, config_.filenames, Case::kUpperCamel) +
           (skip_suffix ? "" : config_.filename_suffix) +
           (skip_ext ? "" : config_.filename_extension);
  }